

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::MakeAndPushMessage<>
          (PeerManagerImpl *this,CNode *node,string *msg_type)

{
  CConnman *this_00;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff88;
  CSerializedNetMsg local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->m_connman;
  std::__cxx11::string::string((string *)&stack0xffffffffffffff88,msg_type);
  NetMsg::Make<>(&local_58,in_stack_ffffffffffffff88);
  CConnman::PushMessage(this_00,node,&local_58);
  CSerializedNetMsg::~CSerializedNetMsg(&local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakeAndPushMessage(CNode& node, std::string msg_type, Args&&... args) const
    {
        m_connman.PushMessage(&node, NetMsg::Make(std::move(msg_type), std::forward<Args>(args)...));
    }